

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

int __thiscall DmgFactors::Apply(DmgFactors *this,FName *type,int damage)

{
  uint uVar1;
  Node *pNVar2;
  Node *pNVar3;
  double *pdVar4;
  Node *pNVar5;
  
  uVar1 = type->Index;
  pNVar2 = (this->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>).Nodes;
  pNVar3 = pNVar2 + ((this->super_TMap<FName,_double,_THashTraits<FName>,_TValueTraits<double>_>).
                     Size - 1 & uVar1);
  do {
    pNVar5 = pNVar3;
    if ((pNVar5 == (Node *)0x0) || (pNVar5->Next == (Node *)0x1)) {
      pNVar5 = (Node *)0x0;
      break;
    }
    pNVar3 = pNVar5->Next;
  } while ((pNVar5->Pair).Key.Index != uVar1);
  pdVar4 = &(pNVar5->Pair).Value;
  if (pNVar5 == (Node *)0x0) {
    if (uVar1 == 0) {
      pdVar4 = (double *)0x0;
    }
    else {
      do {
        pNVar3 = pNVar2;
        if ((pNVar3 == (Node *)0x0) || (pNVar3->Next == (Node *)0x1)) {
          pNVar3 = (Node *)0x0;
          break;
        }
        pNVar2 = pNVar3->Next;
      } while ((pNVar3->Pair).Key.Index != 0);
      pdVar4 = &(pNVar3->Pair).Value;
      if (pNVar3 == (Node *)0x0) {
        pdVar4 = (double *)0x0;
      }
    }
  }
  if (pdVar4 != (double *)0x0) {
    damage = (int)((double)damage * *pdVar4);
  }
  return damage;
}

Assistant:

int DmgFactors::Apply(FName type, int damage)
{
	auto pdf = CheckKey(type);
	if (pdf == NULL && type != NAME_None)
	{
		pdf = CheckKey(NAME_None);
	}
	if (!pdf) return damage;
	return int(damage * *pdf);
}